

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<char>::output_padding(ostream *os,int n,char fillchar)

{
  string padding;
  
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&padding,(long)(int)((3 - (uint)(fillchar == '\0')) * n),' ');
  std::operator<<(os,(string *)&padding);
  std::__cxx11::string::~string((string *)&padding);
  return;
}

Assistant:

static void output_padding(std::ostream& os, int n, char fillchar)
    {
        int oneunit = 2*sizeof(T);
        if (fillchar)
            oneunit += 1;
        std::string padding(n*oneunit, ' ');
        os << padding;
    }